

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

void __thiscall CVmBannerManager::flush_all(CVmBannerManager *this,vm_nl_type nl)

{
  CVmConsole *in_RDI;
  size_t slot;
  vm_nl_type in_stack_ffffffffffffffdc;
  CVmFormatterLog *local_18;
  
  for (local_18 = (CVmFormatterLog *)0x0; local_18 < in_RDI->log_str_;
      local_18 = (CVmFormatterLog *)((long)&(local_18->super_CVmFormatter)._vptr_CVmFormatter + 1))
  {
    if (*(long *)(in_RDI->disp_str_->linebuf_ + (long)local_18 * 2 + -10) != 0) {
      CVmConsole::flush(in_RDI,in_stack_ffffffffffffffdc);
    }
  }
  return;
}

Assistant:

void CVmBannerManager::flush_all(VMG_ vm_nl_type nl)
{
    size_t slot;

    /* flush each banner */
    for (slot = 0 ; slot < handles_max_ ; ++slot)
    {
        /* if this slot has a valid banner, flush it */
        if (handles_[slot] != 0)
            ((CVmConsoleBanner *)handles_[slot])->flush(vmg_ nl);
    }
}